

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::CuriosityUpright::CuriosityUpright
          (CuriosityUpright *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat)

{
  ChQuaternion<double> local_140;
  ChVector<double> local_120;
  ChFrame<double> local_108;
  ChVector<double> local_80;
  ChVector<double> local_68;
  ChColor local_50 [2];
  shared_ptr<chrono::ChMaterialSurface> local_38;
  shared_ptr<chrono::ChMaterialSurface> *local_28;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  ChFrame<double> *rel_pos_local;
  string *name_local;
  CuriosityUpright *this_local;
  
  local_28 = mat;
  mat_local = (shared_ptr<chrono::ChMaterialSurface> *)rel_pos;
  rel_pos_local = (ChFrame<double> *)name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_38,mat);
  CuriosityPart::CuriosityPart(&this->super_CuriosityPart,name,rel_pos,&local_38,false);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_38);
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityUpright_002ee9e0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_CuriosityPart).m_mesh_name,"curiosity_steer");
  ChColor::ChColor(local_50,0.4,0.4,0.7);
  ChColor::operator=(&(this->super_CuriosityPart).m_color,local_50);
  (this->super_CuriosityPart).m_mass = 6.0;
  ChVector<double>::ChVector(&local_80,0.007,0.007,0.004);
  ChVector<double>::operator*(&local_68,&local_80,(this->super_CuriosityPart).m_mass);
  ChVector<double>::operator=(&(this->super_CuriosityPart).m_inertia,&local_68);
  ChVector<double>::ChVector(&local_120,0.0,0.0,0.0);
  ChQuaternion<double>::ChQuaternion(&local_140,1.0,0.0,0.0,0.0);
  ChFrame<double>::ChFrame(&local_108,&local_120,&local_140);
  ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_108);
  ChFrame<double>::~ChFrame(&local_108);
  return;
}

Assistant:

CuriosityUpright::CuriosityUpright(const std::string& name,
                                   const ChFrame<>& rel_pos,
                                   std::shared_ptr<ChMaterialSurface> mat)
    : CuriosityPart(name, rel_pos, mat, false) {
    m_mesh_name = "curiosity_steer";
    m_color = ChColor(0.4f, 0.4f, 0.7f);

    m_mass = 6;
    m_inertia = ChVector<>(0.007, 0.007, 0.004) * m_mass;
    m_cog = ChFrame<>();
}